

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int32_t helicsDataBufferFillFromTime(HelicsDataBuffer data,HelicsTime value)

{
  SmallBuffer *store;
  int32_t iVar1;
  baseType local_18;
  
  store = getBuffer(data);
  iVar1 = 0;
  if (store != (SmallBuffer *)0x0) {
    local_18 = count_time<9,_long>::convert(value);
    helics::ValueConverter<long>::convert(&local_18,store);
    iVar1 = (int32_t)store->bufferSize;
  }
  return iVar1;
}

Assistant:

int32_t helicsDataBufferFillFromTime(HelicsDataBuffer data, HelicsTime value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<int64_t>::convert(helics::Time(value).getBaseTimeCode(), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}